

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O2

t_pvalue __thiscall
xemmai::t_derived_primitive<long>::f_do_construct
          (t_derived_primitive<long> *this,t_pvalue *a_stack,size_t a_n)

{
  t_object *ptVar1;
  long *plVar2;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  t_pvalue tVar3;
  long local_20;
  
  f_check<long>(*(t_object **)(a_n + 0x20),L"argument0");
  plVar2 = (long *)(*(ulong *)(a_n + 0x20) + 0x48);
  if (*(ulong *)(a_n + 0x20) < 5) {
    plVar2 = (long *)(a_n + 0x28);
  }
  local_20 = *plVar2;
  ptVar1 = t_type_of<xemmai::t_object>::f_new<long,long>
                     ((t_type_of<xemmai::t_object> *)a_stack,&local_20);
  (this->super_t_derived<xemmai::t_type_of<long>_>).super_t_type_of<long>.
  super_t_derivable<xemmai::t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>,_xemmai::t_derived_primitive<long>_>
  .super_t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>.
  super_t_derives<long,_xemmai::t_type_of<xemmai::t_object>_>.super_t_type_of<xemmai::t_object>.
  v_this = (t_slot)ptVar1;
  tVar3.field_0.v_integer = extraout_RDX.v_integer;
  tVar3.super_t_pointer.v_p = (t_object *)this;
  return tVar3;
}

Assistant:

t_pvalue f_do_construct(t_pvalue* a_stack, size_t a_n)
	{
		f_check<T>(a_stack[2], L"argument0");
		return this->template f_new<T>(f_as<T>(a_stack[2]));
	}